

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O3

error<idx2::mmap_err_code> idx2::MapFile(mmap_file *MMap,i64 Bytes)

{
  int iVar1;
  map_mode mVar2;
  byte *pbVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar6;
  stat Stat;
  stat local_b0;
  
  if (Bytes == 0) {
    iVar1 = fstat(MMap->File,&local_b0);
    if (iVar1 == 0) {
      Bytes = local_b0.st_size;
    }
  }
  mVar2 = MMap->Mode;
  if (mVar2 == Write) {
    iVar1 = posix_fallocate(MMap->File,0,Bytes);
    if (iVar1 == -1) {
      uVar4 = 0x17;
      uVar5 = 0x61;
      goto LAB_001b1037;
    }
    mVar2 = MMap->Mode;
  }
  pbVar3 = (byte *)mmap((void *)0x0,Bytes,(uint)(mVar2 != Read) * 2 + 1,1,MMap->File,0);
  if (pbVar3 == (byte *)0xffffffffffffffff) {
    uVar4 = 0x16;
    uVar5 = 0x6a;
  }
  else {
    (MMap->Buf).Data = pbVar3;
    (MMap->Buf).Bytes = Bytes;
    uVar5 = 0x6e;
    uVar4 = 0;
  }
LAB_001b1037:
  *(char **)(*in_FS_OFFSET + -0x880) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x680) = uVar5;
  eVar6.Code = (int)uVar4;
  eVar6.StackIdx = (char)((ulong)uVar4 >> 0x20);
  eVar6.StrGened = (bool)(char)((ulong)uVar4 >> 0x28);
  eVar6._14_2_ = (short)((ulong)uVar4 >> 0x30);
  eVar6.Msg = "";
  return eVar6;
}

Assistant:

error<mmap_err_code>
MapFile(mmap_file* MMap, i64 Bytes)
{
#if defined(_WIN32)
  LARGE_INTEGER FileSize{ { 0, 0 } };
  if (!GetFileSizeEx(MMap->File, &FileSize) || Bytes != 0)
    FileSize.QuadPart = Bytes;
  MMap->FileMapping =
    CreateFileMapping(MMap->File,
                      NULL,
                      MMap->Mode == map_mode::Read ? PAGE_READONLY : PAGE_READWRITE,
                      FileSize.HighPart,
                      FileSize.LowPart,
                      0);
  if (MMap->FileMapping == NULL)
    return idx2_Error(mmap_err_code::MappingFailed);

  LPVOID MapAddress = MapViewOfFile(MMap->FileMapping,
                                    MMap->Mode == map_mode::Read    ? FILE_MAP_READ
                                    : MMap->Mode == map_mode::Write ? FILE_MAP_WRITE
                                                                    : FILE_MAP_ALL_ACCESS,
                                    0,
                                    0,
                                    0);
  if (MapAddress == NULL)
    return idx2_Error(mmap_err_code::MapViewFailed);
  MMap->Buf.Data = (byte*)MapAddress;
  MMap->Buf.Bytes = FileSize.QuadPart;
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  size_t FileSize;
  struct ::stat Stat;
  if (Bytes != 0)
    FileSize = Bytes;
  else if (fstat(MMap->File, &Stat) == 0)
    FileSize = Stat.st_size;
  if (MMap->Mode == map_mode::Write)
#if defined(__APPLE__)
    if (!mac_fallocate(MMap->File, FileSize))
      return idx2_Error(mmap_err_code::AllocateFailed);
#else
    if (posix_fallocate(MMap->File, 0, FileSize) == -1)
      return idx2_Error(mmap_err_code::AllocateFailed);
#endif
  void* MapAddress = mmap(0,
                          FileSize,
                          MMap->Mode == map_mode::Read ? PROT_READ : PROT_READ | PROT_WRITE,
                          MAP_SHARED,
                          MMap->File,
                          0);
  if (MapAddress == MAP_FAILED)
    return idx2_Error(mmap_err_code::MapViewFailed);
  MMap->Buf.Data = (byte*)MapAddress;
  MMap->Buf.Bytes = FileSize;
#endif
  return idx2_Error(mmap_err_code::NoError);
}